

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

int flatcc_builder_start_vector
              (flatcc_builder_t *B,size_t elem_size,uint16_t align,size_t max_count)

{
  __flatcc_builder_frame_t *p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint16_t align_00;
  uint uVar5;
  
  align_00 = 4;
  if (4 < align) {
    align_00 = align;
  }
  iVar2 = enter_frame(B,align_00);
  iVar3 = -1;
  if (iVar2 == 0) {
    (B->frame->container).table.vs_end = (flatbuffers_uoffset_t)elem_size;
    (B->frame->container).table.pl_end = 0;
    (B->frame->container).table.vt_hash = (uint32_t)max_count;
    p_Var1 = B->frame;
    p_Var1->type = 4;
    uVar4 = (int)B->buffers[1].iov_len - B->ds_first;
    uVar5 = 0xfffffffc;
    if (uVar4 < 0xfffffffc) {
      uVar5 = uVar4;
    }
    B->ds = (uint8_t *)((ulong)B->ds_first + (long)B->buffers[1].iov_base);
    B->ds_limit = uVar5;
    p_Var1->type_limit = 0xfffffffc;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int flatcc_builder_start_vector(flatcc_builder_t *B, size_t elem_size, uint16_t align, size_t max_count)
{
    get_min_align(&align, field_size);
    if (enter_frame(B, align)) {
        return -1;
    }
    frame(container.vector.elem_size) = (uoffset_t)elem_size;
    frame(container.vector.count) = 0;
    frame(container.vector.max_count) = (uoffset_t)max_count;
    frame(type) = flatcc_builder_vector;
    refresh_ds(B, data_limit);
    return 0;
}